

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  void *pvVar1;
  ulong in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  bool bVar2;
  uint string2_begin;
  uint length;
  LodePNGDecompressSettings zlibsettings;
  size_t size;
  uint i;
  uint error;
  uint local_64;
  undefined1 local_60 [8];
  LodePNGDecompressSettings *settings;
  size_t in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  LodePNGDecompressSettings *outsize;
  uint uVar3;
  undefined4 uVar4;
  uint local_4;
  
  uVar4 = 0;
  outsize = (LodePNGDecompressSettings *)0x0;
  memcpy(local_60,in_RSI,0x28);
  if (*(int *)(in_RDI + 0xfc) != 0) {
    lodepng_clear_icc((LodePNGInfo *)0x34dcd5);
  }
  *(undefined4 *)(in_RDI + 0xfc) = 1;
  local_64 = 0;
  while( true ) {
    bVar2 = false;
    if (local_64 < in_RCX) {
      bVar2 = *(char *)(in_RDX + (ulong)local_64) != '\0';
    }
    if (!bVar2) break;
    local_64 = local_64 + 1;
  }
  if (local_64 + 2 < in_RCX) {
    if ((local_64 == 0) || (0x4f < local_64)) {
      local_4 = 0x59;
    }
    else {
      pvVar1 = lodepng_malloc(0x34dd77);
      *(void **)(in_RDI + 0x100) = pvVar1;
      if (*(long *)(in_RDI + 0x100) == 0) {
        local_4 = 0x53;
      }
      else {
        *(undefined1 *)(*(long *)(in_RDI + 0x100) + (ulong)local_64) = 0;
        for (uVar3 = 0; uVar3 != local_64; uVar3 = uVar3 + 1) {
          *(undefined1 *)(*(long *)(in_RDI + 0x100) + (ulong)uVar3) =
               *(undefined1 *)(in_RDX + (ulong)uVar3);
        }
        if (*(char *)(in_RDX + (ulong)(local_64 + 1)) == '\0') {
          if (in_RCX < local_64 + 2) {
            local_4 = 0x4b;
          }
          else {
            settings = *(LodePNGDecompressSettings **)((long)in_RSI + 0x48);
            local_4 = zlib_decompress((uchar **)CONCAT44(uVar4,uVar3),(size_t *)outsize,
                                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                      in_stack_ffffffffffffffb0,settings);
            if ((local_4 != 0) && (settings < outsize)) {
              local_4 = 0x71;
            }
            *(int *)(in_RDI + 0x110) = (int)outsize;
            if ((local_4 == 0) && (*(int *)(in_RDI + 0x110) == 0)) {
              local_4 = 100;
            }
          }
        }
        else {
          local_4 = 0x48;
        }
      }
    }
  }
  else {
    local_4 = 0x4b;
  }
  return local_4;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;
  size_t size = 0;
  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;

  if(info->iccp_defined) lodepng_clear_icc(info);
  info->iccp_defined = 1;

  for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
  if(length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if(length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if(!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for(i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if(data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if(string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  zlibsettings.max_output_size = decoder->max_icc_size;
  error = zlib_decompress(&info->iccp_profile, &size, 0,
                          &data[string2_begin],
                          length, &zlibsettings);
  /*error: ICC profile larger than decoder->max_icc_size*/
  if(error && size > zlibsettings.max_output_size) error = 113;
  info->iccp_profile_size = (unsigned)size;
  if(!error && !info->iccp_profile_size) error = 100; /*invalid ICC profile size*/
  return error;
}